

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

char * glfwGetJoystickName(int jid)

{
  int iVar1;
  char *pcVar2;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/input.c"
                  ,0x3e3,"const char *glfwGetJoystickName(int)");
  }
  if ((uint)jid < 0x10) {
    if (_glfw.initialized == 0) {
      pcVar2 = (char *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (_glfw.joysticks[(uint)jid].present == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)0x0;
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
      if (iVar1 != 0) {
        pcVar2 = _glfw.joysticks[(uint)jid].name;
      }
    }
    return pcVar2;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/input.c"
                ,0x3e4,"const char *glfwGetJoystickName(int)");
}

Assistant:

GLFWAPI const char* glfwGetJoystickName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    return js->name;
}